

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O2

sFace * __thiscall gjkepa2_impl::EPA::newface(EPA *this,sSV *a,sSV *b,sSV *c,bool forced)

{
  cbtVector3 *v2;
  cbtScalar *dist;
  sFace *face;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _ _Var4;
  bool bVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar12;
  cbtScalar l;
  undefined1 auStack_4c [12];
  cbtVector3 local_40;
  undefined1 auVar11 [56];
  
  auVar11 = in_ZMM0._8_56_;
  face = (this->m_stock).root;
  if (face == (sFace *)0x0) {
    this->m_status = OutOfFaces;
  }
  else {
    remove((EPA *)&this->m_stock,(char *)face);
    append(&this->m_hull,face);
    v2 = &a->w;
    face->pass = '\0';
    face->c[0] = a;
    face->c[1] = b;
    face->c[2] = c;
    cVar12 = ::operator-(&b->w,v2);
    auVar8._0_8_ = cVar12.m_floats._0_8_;
    auVar8._8_56_ = auVar11;
    auVar1._8_8_ = in_XMM1_Qb;
    auVar1._0_8_ = cVar12.m_floats._8_8_;
    _l = (cbtScalar  [4])vmovlhps_avx(auVar8._0_16_,auVar1);
    auVar11 = ZEXT856(l._8_8_);
    cVar12 = ::operator-(&c->w,v2);
    auVar9._0_8_ = cVar12.m_floats._0_8_;
    auVar9._8_56_ = auVar11;
    auVar2._8_8_ = in_XMM1_Qb;
    auVar2._0_8_ = cVar12.m_floats._8_8_;
    local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar9._0_16_,auVar2);
    auVar11 = ZEXT856(local_40.m_floats._8_8_);
    cVar12 = cbtVector3::cross((cbtVector3 *)&l,&local_40);
    auVar10._0_8_ = cVar12.m_floats._0_8_;
    auVar10._8_56_ = auVar11;
    auVar3._8_8_ = in_XMM1_Qb;
    auVar3._0_8_ = cVar12.m_floats._8_8_;
    auVar1 = vmovlhps_avx(auVar10._0_16_,auVar3);
    *(undefined1 (*) [16])(face->n).m_floats = auVar1;
    cVar6 = cbtVector3::length(&face->n);
    l = cVar6;
    if (cVar6 <= 0.0001) {
      _Var4 = Degenerated;
    }
    else {
      dist = &face->d;
      bVar5 = getedgedist(this,face,a,b,dist);
      if (((!bVar5) && (bVar5 = getedgedist(this,face,b,c,dist), !bVar5)) &&
         (bVar5 = getedgedist(this,face,c,a,dist), !bVar5)) {
        cVar7 = cbtVector3::dot(v2,&face->n);
        face->d = cVar7 / cVar6;
      }
      cbtVector3::operator/=(&face->n,&l);
      if (forced) {
        return face;
      }
      if (-1e-05 <= *dist) {
        return face;
      }
      _Var4 = NonConvex;
    }
    this->m_status = _Var4;
    remove((EPA *)&this->m_hull,(char *)face);
    append(&this->m_stock,face);
  }
  return (sFace *)0x0;
}

Assistant:

sFace* newface(sSV* a, sSV* b, sSV* c, bool forced)
	{
		if (m_stock.root)
		{
			sFace* face = m_stock.root;
			remove(m_stock, face);
			append(m_hull, face);
			face->pass = 0;
			face->c[0] = a;
			face->c[1] = b;
			face->c[2] = c;
			face->n = cbtCross(b->w - a->w, c->w - a->w);
			const cbtScalar l = face->n.length();
			const bool v = l > EPA_ACCURACY;

			if (v)
			{
				if (!(getedgedist(face, a, b, face->d) ||
					  getedgedist(face, b, c, face->d) ||
					  getedgedist(face, c, a, face->d)))
				{
					// Origin projects to the interior of the triangle
					// Use distance to triangle plane
					face->d = cbtDot(a->w, face->n) / l;
				}

				face->n /= l;
				if (forced || (face->d >= -EPA_PLANE_EPS))
				{
					return face;
				}
				else
					m_status = eStatus::NonConvex;
			}
			else
				m_status = eStatus::Degenerated;

			remove(m_hull, face);
			append(m_stock, face);
			return 0;
		}
		m_status = m_stock.root ? eStatus::OutOfVertices : eStatus::OutOfFaces;
		return 0;
	}